

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_cookie_clearsess(CookieInfo *cookies)

{
  Cookie *pCVar1;
  Cookie *pCVar2;
  uint local_34;
  Cookie *pCStack_30;
  uint i;
  Cookie *prev;
  Cookie *next;
  Cookie *curr;
  Cookie *first;
  CookieInfo *cookies_local;
  
  if (cookies != (CookieInfo *)0x0) {
    for (local_34 = 0; local_34 < 0x100; local_34 = local_34 + 1) {
      if (cookies->cookies[local_34] != (Cookie *)0x0) {
        pCStack_30 = cookies->cookies[local_34];
        next = pCStack_30;
        curr = pCStack_30;
        while (next != (Cookie *)0x0) {
          pCVar1 = next->next;
          if (next->expires == 0) {
            if (curr == next) {
              curr = pCVar1;
            }
            pCVar2 = pCVar1;
            if (pCStack_30 != next) {
              pCStack_30->next = pCVar1;
              pCVar2 = pCStack_30;
            }
            pCStack_30 = pCVar2;
            freecookie(next);
            cookies->numcookies = cookies->numcookies + -1;
            next = pCVar1;
          }
          else {
            pCStack_30 = next;
            next = pCVar1;
          }
        }
        cookies->cookies[local_34] = curr;
      }
    }
  }
  return;
}

Assistant:

void Curl_cookie_clearsess(struct CookieInfo *cookies)
{
  struct Cookie *first, *curr, *next, *prev = NULL;
  unsigned int i;

  if(!cookies)
    return;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    if(!cookies->cookies[i])
      continue;

    first = curr = prev = cookies->cookies[i];

    for(; curr; curr = next) {
      next = curr->next;
      if(!curr->expires) {
        if(first == curr)
          first = next;

        if(prev == curr)
          prev = next;
        else
          prev->next = next;

        freecookie(curr);
        cookies->numcookies--;
      }
      else
        prev = curr;
    }

    cookies->cookies[i] = first;
  }
}